

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.h
# Opt level: O2

ExpectedRef<const_std::string,_std::string> * __thiscall
yaml::Value::getString_abi_cxx11_
          (ExpectedRef<const_std::string,_std::string> *__return_storage_ptr__,Value *this)

{
  allocator<char> local_59;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [8];
  undefined8 uStack_20;
  
  if (this->type_ == String) {
    (__return_storage_ptr__->field_0).value_._M_data = &this->string_;
    __return_storage_ptr__->has_value_ = true;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Value is not of String type",&local_59);
    local_38 = local_28;
    if (local_58 == local_48) {
      uStack_20 = uStack_40;
    }
    else {
      local_38 = local_58;
    }
    local_30 = local_50;
    local_50 = 0;
    local_48[0] = 0;
    local_58 = local_48;
    Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(UnexpectedType *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpectedRef<const std::string, std::string> getString() const {
		if (type_ != Type::String)
			return Unexpected<std::string>("Value is not of String type");
		return std::cref(string_);
	}